

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::ColumnChunk::__set_crypto_metadata(ColumnChunk *this,ColumnCryptoMetaData *val)

{
  ColumnCryptoMetaData *in_RSI;
  ColumnCryptoMetaData *in_RDI;
  
  ColumnCryptoMetaData::operator=(in_RSI,in_RDI);
  *(byte *)&in_RDI[6].ENCRYPTION_WITH_COLUMN_KEY.key_metadata._M_string_length =
       (byte)in_RDI[6].ENCRYPTION_WITH_COLUMN_KEY.key_metadata._M_string_length & 0xbf | 0x40;
  return;
}

Assistant:

void ColumnChunk::__set_crypto_metadata(const ColumnCryptoMetaData& val) {
  this->crypto_metadata = val;
__isset.crypto_metadata = true;
}